

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_tas_tatas_ticket.cpp
# Opt level: O0

void test_scalable_tas_tatas_ticket_driver(void)

{
  allocator<char> local_89;
  string local_88;
  allocator<char> local_61;
  string local_60;
  allocator<char> local_29;
  string local_28;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"tas lock with exponential backoff",&local_29);
  test_mutex_tas_tatas_ticket<scalable_locks::Test_and_set_lock>(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::allocator<char>::~allocator(&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"tatas lock with exponential backoff",&local_61);
  test_mutex_tas_tatas_ticket<scalable_locks::Test_and_test_and_set_lock>(&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"ticket lock with exponential backoff",&local_89);
  test_mutex_tas_tatas_ticket<scalable_locks::Ticket_lock>(&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  return;
}

Assistant:

void test_scalable_tas_tatas_ticket_driver() {
    test_mutex_tas_tatas_ticket<scalable_locks::Test_and_set_lock>("tas lock with exponential backoff");
    test_mutex_tas_tatas_ticket<scalable_locks::Test_and_test_and_set_lock>("tatas lock with exponential backoff");
    test_mutex_tas_tatas_ticket<scalable_locks::Ticket_lock>("ticket lock with exponential backoff");
}